

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

TFilterCoefficients *
calculateCoefficientsSecondOrderButterworthHighPass
          (TFilterCoefficients *__return_storage_ptr__,int fc,int fs)

{
  double dVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  __return_storage_ptr__->c0 = 0.0;
  __return_storage_ptr__->d0 = 0.0;
  __return_storage_ptr__->xnz1 = 0.0;
  __return_storage_ptr__->xnz2 = 0.0;
  __return_storage_ptr__->ynz1 = 0.0;
  __return_storage_ptr__->ynz2 = 0.0;
  dVar1 = tan(((double)fc * 3.141592653589793) / (double)fs);
  fVar4 = (float)dVar1;
  fVar2 = fVar4 * fVar4;
  fVar3 = 1.0 / (fVar4 * 1.4142135 + 1.0 + fVar2);
  __return_storage_ptr__->a0 = fVar3;
  __return_storage_ptr__->a1 = fVar3 * -2.0;
  __return_storage_ptr__->a2 = fVar3;
  __return_storage_ptr__->b1 = (fVar3 + fVar3) * (fVar2 + -1.0);
  __return_storage_ptr__->b2 = fVar3 * (fVar2 + fVar4 * -1.4142135 + 1.0);
  return __return_storage_ptr__;
}

Assistant:

TFilterCoefficients calculateCoefficientsSecondOrderButterworthHighPass(int fc, int fs) {
    TFilterCoefficients res;

    float c = tan(pi*fc / fs);
    res.a0 = 1.0 / (1.0 + sqrt2*c + pow(c, 2.0));
    res.a1 = -2.0 * res.a0;
    res.a2 = res.a0;
    res.b1 = 2.0 * res.a0*(pow(c, 2.0) - 1.0);
    res.b2 = res.a0 * (1.0 - sqrt2*c + pow(c, 2.0));

    return res;
}